

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlnNdr.c
# Opt level: O1

void * Wln_NtkToNdr(Wln_Ntk_t *p)

{
  byte bVar1;
  int RangeLeft;
  byte *pbVar2;
  Vec_Int_t *pVVar3;
  int *pDesign;
  undefined1 *puVar4;
  undefined8 *puVar5;
  long lVar6;
  ulong uVar7;
  Vec_Int_t *pVVar8;
  int *piVar9;
  Wln_Vec_t *pWVar10;
  int *pOutputs;
  int iVar11;
  uint uVar12;
  int InstName;
  int RangeRight;
  long lVar13;
  long lVar14;
  int *in_stack_ffffffffffffff88;
  char *pcVar15;
  int local_54;
  int local_50;
  int local_4c;
  long local_48;
  ulong local_40;
  int *local_38;
  
  pDesign = (int *)malloc(0x18);
  pDesign[0] = 0;
  pDesign[1] = 0x10;
  puVar4 = (undefined1 *)malloc(0x10);
  *(undefined1 **)(pDesign + 2) = puVar4;
  pcVar15 = (char *)0x37f137;
  puVar5 = (undefined8 *)malloc(0x100);
  *(undefined8 **)(pDesign + 4) = puVar5;
  *puVar4 = 1;
  *pDesign = 1;
  *(undefined4 *)puVar5 = 0;
  puVar4[1] = 7;
  *pDesign = 2;
  *puVar5 = 0x100000002;
  *(undefined1 *)(*(long *)(pDesign + 2) + 2) = 2;
  iVar11 = *pDesign;
  *pDesign = iVar11 + 1;
  *(undefined4 *)(*(long *)(pDesign + 4) + (long)iVar11 * 4) = 0;
  *(undefined1 *)(*(long *)(pDesign + 2) + (long)*pDesign) = 7;
  piVar9 = *(int **)(pDesign + 4);
  iVar11 = *pDesign;
  *pDesign = iVar11 + 1;
  piVar9[iVar11] = 1;
  pbVar2 = *(byte **)(pDesign + 2);
  bVar1 = pbVar2[2];
  if (bVar1 != 0) {
    if (bVar1 < 4) {
      piVar9[2] = piVar9[2] + *pDesign + -2;
      bVar1 = *pbVar2;
      if (bVar1 == 0) goto LAB_0037f5cb;
      if (bVar1 < 4) {
        iVar11 = *pDesign + -2 + *piVar9;
        *piVar9 = iVar11;
        if (iVar11 != *pDesign) {
          __assert_fail("(int)p->pBody[0] == p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/miniaig/ndr.h"
                        ,0x21c,"int Ndr_AddModule(void *, int)");
        }
        uVar12 = (p->vCis).nSize;
        uVar7 = (ulong)uVar12;
        if ((p->vFfs).nSize < (int)uVar12) {
          lVar13 = 0;
          do {
            if ((int)uVar7 <= lVar13) goto LAB_0037f56e;
            local_54 = (p->vCis).pArray[lVar13];
            lVar6 = (long)local_54;
            if ((lVar6 < 0) || ((p->vRanges).nSize <= local_54)) goto LAB_0037f56e;
            iVar11 = (p->vRanges).pArray[lVar6];
            if (iVar11 < 0) goto LAB_0037f58d;
            pVVar8 = p->pRanges->vObjs;
            uVar12 = iVar11 * 4;
            if (pVVar8->nSize <= (int)uVar12) goto LAB_0037f58d;
            if ((p->vSigns).nSize <= local_54) goto LAB_0037f5ac;
            piVar9 = pVVar8->pArray;
            in_stack_ffffffffffffff88 = (int *)0x0;
            Ndr_AddObject(pDesign,0x102,3,piVar9[uVar12],piVar9[(ulong)uVar12 + 1],
                          (int)(p->vSigns).pArray[lVar6],0,0,(int *)0x1,(int)&local_54,(int *)0x0,
                          pcVar15);
            lVar13 = lVar13 + 1;
            uVar7 = (ulong)(p->vCis).nSize;
          } while (lVar13 < (long)(uVar7 - (long)(p->vFfs).nSize));
        }
        pVVar8 = (Vec_Int_t *)malloc(0x10);
        pVVar8->nCap = 0x10;
        pVVar8->nSize = 0;
        pcVar15 = (char *)0x37f2d0;
        piVar9 = (int *)malloc(0x40);
        pVVar8->pArray = piVar9;
        local_54 = 1;
        if (1 < (p->vTypes).nSize) {
          lVar6 = 1;
          lVar13 = 0x18;
          local_38 = pDesign;
          do {
            if ((p->vTypes).pArray[lVar6] - 5U < 0xfffffffe) {
              pVVar8->nSize = 0;
              pWVar10 = p->vFanins;
              uVar7 = (ulong)(uint)pWVar10[lVar6].nSize;
              local_48 = lVar13;
              if (0 < pWVar10[lVar6].nSize) {
                lVar14 = 0;
                do {
                  if ((int)uVar7 < 3) {
                    piVar9 = (int *)((long)&pWVar10->nCap + lVar13);
                  }
                  else {
                    piVar9 = pWVar10[lVar6].field_2.pArray[0] + lVar14;
                  }
                  if (*piVar9 != 0) {
                    pcVar15 = (char *)0x37f35e;
                    Vec_IntPush(pVVar8,*piVar9);
                  }
                  lVar14 = lVar14 + 1;
                  pWVar10 = p->vFanins;
                  uVar7 = (ulong)pWVar10[lVar6].nSize;
                  lVar13 = lVar13 + 4;
                } while (lVar14 < (long)uVar7);
              }
              if (((p->vTypes).nSize <= lVar6) || ((p->vRanges).nSize <= lVar6)) goto LAB_0037f56e;
              iVar11 = (p->vRanges).pArray[lVar6];
              if (iVar11 < 0) goto LAB_0037f58d;
              pVVar3 = p->pRanges->vObjs;
              uVar12 = iVar11 * 4;
              if (pVVar3->nSize <= (int)uVar12) goto LAB_0037f58d;
              if ((p->vSigns).nSize <= lVar6) goto LAB_0037f5ac;
              iVar11 = (p->vTypes).pArray[lVar6];
              piVar9 = pVVar3->pArray;
              InstName = piVar9[uVar12];
              RangeLeft = piVar9[(ulong)uVar12 + 1];
              RangeRight = (int)(p->vSigns).pArray[lVar6];
              uVar7 = (ulong)(uint)pVVar8->nSize;
              piVar9 = pVVar8->pArray;
              if (iVar11 == 0x61) {
                pcVar15 = (char *)0x37f40c;
                local_50 = RangeRight;
                local_4c = InstName;
                local_40 = uVar7;
                pOutputs = (int *)Wln_ObjConstString(p,(int)lVar6);
                uVar7 = local_40;
                InstName = local_4c;
                RangeRight = local_50;
              }
              else {
                pOutputs = (int *)0x0;
              }
              pDesign = local_38;
              in_stack_ffffffffffffff88 = (int *)0x0;
              Ndr_AddObject(local_38,0x102,iVar11,InstName,RangeLeft,RangeRight,(int)uVar7,
                            (int)piVar9,(int *)0x1,(int)&local_54,pOutputs,pcVar15);
              lVar13 = local_48;
            }
            lVar6 = lVar6 + 1;
            local_54 = (int)lVar6;
            lVar13 = lVar13 + 0x10;
          } while (lVar6 < (p->vTypes).nSize);
        }
        if (pVVar8->pArray != (int *)0x0) {
          free(pVVar8->pArray);
          pVVar8->pArray = (int *)0x0;
        }
        pcVar15 = (char *)0x37f486;
        free(pVVar8);
        uVar12 = (p->vCos).nSize;
        uVar7 = (ulong)uVar12;
        if ((p->vFfs).nSize < (int)uVar12) {
          lVar13 = 0;
          do {
            if ((int)uVar7 <= lVar13) {
LAB_0037f56e:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                            ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
            }
            local_54 = (p->vCos).pArray[lVar13];
            lVar6 = (long)local_54;
            if ((lVar6 < 0) || ((p->vRanges).nSize <= local_54)) goto LAB_0037f56e;
            iVar11 = (p->vRanges).pArray[lVar6];
            if (iVar11 < 0) {
LAB_0037f58d:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                            ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
            }
            pVVar8 = p->pRanges->vObjs;
            uVar12 = iVar11 * 4;
            if (pVVar8->nSize <= (int)uVar12) goto LAB_0037f58d;
            if ((p->vSigns).nSize <= local_54) {
LAB_0037f5ac:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecStr.h"
                            ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
            }
            piVar9 = pVVar8->pArray;
            in_stack_ffffffffffffff88 =
                 (int *)((ulong)in_stack_ffffffffffffff88 & 0xffffffff00000000);
            Ndr_AddObject(pDesign,0x102,4,piVar9[uVar12],piVar9[(ulong)uVar12 + 1],
                          (int)(p->vSigns).pArray[lVar6],1,(int)&local_54,in_stack_ffffffffffffff88,
                          0,(int *)0x0,pcVar15);
            lVar13 = lVar13 + 1;
            uVar7 = (ulong)(p->vCos).nSize;
          } while (lVar13 < (long)(uVar7 - (long)(p->vFfs).nSize));
        }
        return pDesign;
      }
    }
    __assert_fail("Ndr_DataType(p, i) <= NDR_OBJECT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/miniaig/ndr.h"
                  ,0x83,"void Ndr_DataAddTo(Ndr_Data_t *, int, int)");
  }
LAB_0037f5cb:
  __assert_fail("p->pHead[i]",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/miniaig/ndr.h"
                ,0x7e,"int Ndr_DataType(Ndr_Data_t *, int)");
}

Assistant:

ABC_NAMESPACE_IMPL_START

////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    []

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void * Wln_NtkToNdr( Wln_Ntk_t * p )
{
    Vec_Int_t * vFanins;
    int i, k, iObj, iFanin;
    // create a new module
    void * pDesign = Ndr_Create( 1 );
    int ModId = Ndr_AddModule( pDesign, 1 );
    // add primary inputs
    Wln_NtkForEachPi( p, iObj, i ) 
    {
        Ndr_AddObject( pDesign, ModId, ABC_OPER_CI, 0,   
            Wln_ObjRangeEnd(p, iObj), Wln_ObjRangeBeg(p, iObj), Wln_ObjIsSigned(p, iObj),   
            0, NULL,  1, &iObj,  NULL  ); // no fanins
    }
    // add internal nodes 
    vFanins = Vec_IntAlloc( 10 );
    Wln_NtkForEachObjInternal( p, iObj ) 
    {
        Vec_IntClear( vFanins );
        Wln_ObjForEachFanin( p, iObj, iFanin, k )
            Vec_IntPush( vFanins, iFanin );
        Ndr_AddObject( pDesign, ModId, Wln_ObjType(p, iObj), 0,   
            Wln_ObjRangeEnd(p, iObj), Wln_ObjRangeBeg(p, iObj), Wln_ObjIsSigned(p, iObj),   
            Vec_IntSize(vFanins), Vec_IntArray(vFanins), 1, &iObj,  
            Wln_ObjIsConst(p, iObj) ? Wln_ObjConstString(p, iObj) : NULL ); 
    }
    Vec_IntFree( vFanins );
    // add primary outputs
    Wln_NtkForEachPo( p, iObj, i ) 
    {
        Ndr_AddObject( pDesign, ModId, ABC_OPER_CO, 0,                   
            Wln_ObjRangeEnd(p, iObj), Wln_ObjRangeBeg(p, iObj), Wln_ObjIsSigned(p, iObj),   
            1, &iObj,  0, NULL,  NULL ); 
    }
    return pDesign;
}